

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2gal.cpp
# Opt level: O0

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  CEExecOptions *opts;
  CEExecOptions *in_stack_00000260;
  string *this;
  CEExecOptions *__lhs;
  string *in_stack_fffffffffffffef8;
  CEExecOptions *in_stack_ffffffffffffff00;
  string local_e8 [32];
  string local_c8 [24];
  CEExecOptions *in_stack_ffffffffffffff50;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [24];
  CEExecOptions *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"obs2gal",&local_31);
  CEExecOptions::CEExecOptions(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this = (string *)&stack0xfffffffffffffef8;
  std::__cxx11::string::string(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  CLOptions::AddProgramDescription(&in_RDI->super_CLOptions,(string *)this);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  CEExecOptions::AddObserverPars(in_stack_00000260);
  CEExecOptions::AddObservedPars(in_stack_ffffffffffffffb0);
  CEExecOptions::AddJDPar(in_stack_ffffffffffffff50);
  return __lhs;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("obs2gal");

    // Add a program version and description
    opts.AddProgramDescription(std::string() +
        "Takes observed positions (azimuth,zenith angle) and computes the " +
        "Galactic longitude,latitude positions based on the observer location " +
        "and atmospheric properties. The only values necessary to get rough " +
        "coordinates are 'longitude', 'latitude', 'azimuth', 'zenith', and " +
        "'juliandate'.") ;
    
    // Setup the defaults
    opts.AddObserverPars();
    opts.AddObservedPars();
    opts.AddJDPar();

    return opts ;
}